

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void regenerateSpherePositions(void)

{
  pointer ptVar1;
  size_t sVar2;
  ulong uVar3;
  int phi_i;
  ulong uVar4;
  long lVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  
  std::vector<glm::detail::tvec3<float>,_std::allocator<glm::detail::tvec3<float>_>_>::resize
            (&sphere_positions,(ulong)(uint)(((int)theta_n + 1) * ((int)phi_n + 1)));
  sVar2 = 0;
  for (uVar4 = 0; uVar4 <= CONCAT44(phi_n._4_4_,(int)phi_n); uVar4 = uVar4 + 1) {
    fVar6 = ((float)(int)uVar4 * 3.1415927) / (float)CONCAT44(phi_n._4_4_,(int)phi_n);
    fVar7 = cosf(fVar6);
    fVar6 = sinf(fVar6);
    lVar5 = sVar2 * 0xc + 8;
    for (uVar3 = 0; uVar3 <= CONCAT44(theta_n._4_4_,(int)theta_n); uVar3 = uVar3 + 1) {
      fVar8 = ((float)(int)uVar3 * 6.2831855) / (float)CONCAT44(theta_n._4_4_,(int)theta_n);
      fVar9 = sinf(fVar8);
      fVar8 = cosf(fVar8);
      ptVar1 = sphere_positions.
               super__Vector_base<glm::detail::tvec3<float>,_std::allocator<glm::detail::tvec3<float>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      *(float *)((long)sphere_positions.
                       super__Vector_base<glm::detail::tvec3<float>,_std::allocator<glm::detail::tvec3<float>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + lVar5 + -8) = fVar9 * fVar6;
      *(float *)((long)ptVar1 + lVar5 + -4) = -fVar7;
      *(float *)((long)&ptVar1->field_0 + lVar5) = fVar8 * fVar6;
      lVar5 = lVar5 + 0xc;
    }
    sVar2 = sVar2 + uVar3;
  }
  vertex_count = sVar2;
  (*__glewBindBuffer)(0x8892,sphere_buffer);
  (*__glewBufferData)(0x8892,sVar2 * 0xc,
                      sphere_positions.
                      super__Vector_base<glm::detail::tvec3<float>,_std::allocator<glm::detail::tvec3<float>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,0x88e4);
  return;
}

Assistant:

void regenerateSpherePositions() {
    Perf stat("Regenerate Sphere positions");
    sphere_positions.resize(uint((phi_n + 1) * (theta_n + 1)));
    size_t n = 0;
    for (int phi_i = 0; phi_i <= phi_n; phi_i++) {
        float phi = float(M_PI) * phi_i / phi_n;
        float y = -cos(phi);
        float r = sin(phi); // cylindrical radius

        for (int theta_i = 0; theta_i <= theta_n; theta_i++) {
            float theta = float(M_PI) * 2 * theta_i / theta_n;
            float x = r * sin(theta);
            float z = r * cos(theta);
            sphere_positions[n++] = vec3(x, y, z);
        }
    }

    vertex_count = n;

    glBindBuffer(GL_ARRAY_BUFFER, sphere_buffer);
    glBufferData(GL_ARRAY_BUFFER, n * sizeof(vec3), sphere_positions.data(), GL_STATIC_DRAW);
}